

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method_property.cpp
# Opt level: O0

void __thiscall
MethodProperty_SetFromProperty_Test::TestBody(MethodProperty_SetFromProperty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  int *piVar3;
  string *psVar4;
  AssertHelper local_600;
  Message local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_22;
  Message local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  undefined1 local_590 [8];
  AssertionResult gtest_ar_21;
  Message local_578;
  longlong local_570;
  int local_564;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_20;
  Message local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_19;
  Message local_508;
  longlong local_500;
  int local_4f4;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_18;
  Message local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_17;
  Message local_498;
  int local_490 [2];
  undefined1 local_488 [8];
  AssertionResult gtest_ar_16;
  Message local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_15;
  Message local_430;
  int local_428 [2];
  undefined1 local_420 [8];
  AssertionResult gtest_ar_14;
  Message local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_13;
  Message local_3c8;
  int local_3c0 [2];
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_12;
  Message local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_11;
  Message local_360;
  int local_358 [2];
  undefined1 local_350 [8];
  AssertionResult gtest_ar_10;
  Message local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_9;
  Message local_2f8;
  int local_2f0 [2];
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_8;
  Message local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_7;
  Message local_290;
  longlong local_288;
  undefined4 local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_6;
  Message local_260;
  int local_258 [2];
  undefined1 local_250 [8];
  AssertionResult gtest_ar_5;
  Message local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_4;
  Message local_1f8;
  int local_1f0 [2];
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_3;
  Message local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_2;
  Message local_190;
  int local_188 [2];
  undefined1 local_180 [8];
  AssertionResult gtest_ar_1;
  Message local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  AssertionResult gtest_ar;
  undefined1 local_120 [8];
  BasicMethodProperties obj2;
  BasicMethodProperties obj;
  MethodProperty_SetFromProperty_Test *this_local;
  
  obj._128_8_ = this;
  BasicMethodProperties::BasicMethodProperties((BasicMethodProperties *)&obj2.field_0x80);
  BasicMethodProperties::BasicMethodProperties((BasicMethodProperties *)local_120);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>_>
  ::operator()(&local_160,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>_>
                *)((long)&obj.m_long_value + 7));
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_140,"\"\"","obj.string_value()",(char (*) [1])0x1827b7,
             &local_160);
  std::__cxx11::string::~string((string *)&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x245,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_188[1] = 0;
  local_188[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::setIntValue2>,_4UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::setIntValue2>,_4UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>_>
                               *)((long)&obj.m_long_value + 4));
  testing::internal::EqHelper<true>::Compare<int,int>
            (local_180,"0",(int *)"obj.int_value()",local_188 + 1,local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x246,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::setStringValue2CRef>,_8UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>_>
  ::operator()(&local_1c8,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::setStringValue2CRef>,_8UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>_>
                *)&obj.field_0x78);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_1a8,"\"\"","obj.string_value2()",(char (*) [1])0x1827b7,
             &local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x247,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  local_1f0[1] = 0;
  local_1f0[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::setIntValue2CRef>,_5UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::setIntValue2CRef>,_5UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>_>
                               *)((long)&obj.m_long_value + 5));
  testing::internal::EqHelper<true>::Compare<int,int>
            (local_1e8,"0",(int *)"obj.int_value2()",local_1f0 + 1,local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x248,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_&BasicMethodProperties::setStringValue2RVRef>,_9UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>_>
  ::operator()(&local_230,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_&BasicMethodProperties::setStringValue2RVRef>,_9UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>_>
                *)&obj.field_0x79);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_210,"\"\"","obj.string_value3()",(char (*) [1])0x1827b7,
             &local_230);
  std::__cxx11::string::~string((string *)&local_230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x249,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_258[1] = 0;
  local_258[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_int_&&,_&BasicMethodProperties::setIntValue2RVRef>,_6UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_int_&&,_&BasicMethodProperties::setIntValue2RVRef>,_6UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>_>
                               *)((long)&obj.m_long_value + 6));
  testing::internal::EqHelper<true>::Compare<int,int>
            (local_250,"0",(int *)"obj.int_value3()",local_258 + 1,local_258);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x24a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  local_27c = 0;
  local_288 = prop::detail::
              PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_long_long,_prop::detail::GetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::getLongValue>,_prop::detail::SetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::setLongValue>,_13UL,_prop::ReadWrite>,_BasicMethodProperties,_long_long,_prop::detail::GetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::getLongValue>_>
              ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_long_long,_prop::detail::GetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::getLongValue>,_prop::detail::SetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::setLongValue>,_13UL,_prop::ReadWrite>,_BasicMethodProperties,_long_long,_prop::detail::GetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::getLongValue>_>
                            *)&obj.field_0x7d);
  testing::internal::EqHelper<true>::Compare<int,long_long>
            (local_278,"0",(int *)"obj.long_value()",(longlong *)&local_27c,&local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x24b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  piVar3 = BasicMethodProperties::getIntValue2Test((BasicMethodProperties *)local_120);
  *piVar3 = 0x41;
  psVar4 = BasicMethodProperties::getStringValue2Test_abi_cxx11_((BasicMethodProperties *)local_120)
  ;
  std::__cxx11::string::operator=((string *)psVar4,"bob");
  prop::
  MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>
               *)((long)&obj.m_long_value + 7),
              (MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>
               *)((long)&obj2.m_long_value + 7));
  prop::
  MethodProperty<BasicMethodProperties,int,prop::detail::GetterWrapper<BasicMethodProperties,int,&(BasicMethodProperties::getIntValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,int,&BasicMethodProperties::setIntValue2>,4ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,int,prop::detail::GetterWrapper<BasicMethodProperties,int,&(BasicMethodProperties::getIntValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,int,&BasicMethodProperties::setIntValue2>,4ul,prop::ReadWrite>
               *)((long)&obj.m_long_value + 4),
              (MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::setIntValue2>,_4UL,_prop::ReadWrite>
               *)((long)&obj2.m_long_value + 4));
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>_>
  ::operator()(&local_2c8,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>_>
                *)((long)&obj.m_long_value + 7));
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_2a8,"\"bob\"","obj.string_value()",(char (*) [4])"bob",
             &local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x251,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  local_2f0[1] = 0x41;
  local_2f0[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::setIntValue2>,_4UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::setIntValue2>,_4UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>_>
                               *)((long)&obj.m_long_value + 4));
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_2e8,"65","obj.int_value()",local_2f0 + 1,local_2f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x252,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  piVar3 = BasicMethodProperties::getIntValue2Test((BasicMethodProperties *)local_120);
  *piVar3 = 0x17;
  psVar4 = BasicMethodProperties::getStringValue2Test_abi_cxx11_((BasicMethodProperties *)local_120)
  ;
  std::__cxx11::string::operator=((string *)psVar4,"bill");
  prop::
  MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>
               *)((long)&obj.m_long_value + 7),
              (MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::setStringValue2CRef>,_8UL,_prop::ReadWrite>
               *)&obj2.field_0x78);
  prop::
  MethodProperty<BasicMethodProperties,int,prop::detail::GetterWrapper<BasicMethodProperties,int,&(BasicMethodProperties::getIntValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,int,&BasicMethodProperties::setIntValue2>,4ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,int,prop::detail::GetterWrapper<BasicMethodProperties,int,&(BasicMethodProperties::getIntValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,int,&BasicMethodProperties::setIntValue2>,4ul,prop::ReadWrite>
               *)((long)&obj.m_long_value + 4),
              (MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::setIntValue2CRef>,_5UL,_prop::ReadWrite>
               *)((long)&obj2.m_long_value + 5));
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>_>
  ::operator()(&local_330,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>_>
                *)((long)&obj.m_long_value + 7));
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_310,"\"bill\"","obj.string_value()",(char (*) [5])"bill",
             &local_330);
  std::__cxx11::string::~string((string *)&local_330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,600,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  local_358[1] = 0x17;
  local_358[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::setIntValue2>,_4UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::setIntValue2>,_4UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>_>
                               *)((long)&obj.m_long_value + 4));
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_350,"23","obj.int_value()",local_358 + 1,local_358);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x259,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  piVar3 = BasicMethodProperties::getIntValueTest((BasicMethodProperties *)local_120);
  *piVar3 = 0x48;
  psVar4 = BasicMethodProperties::getStringValueTest_abi_cxx11_((BasicMethodProperties *)local_120);
  std::__cxx11::string::operator=((string *)psVar4,"john");
  prop::
  MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>
               *)((long)&obj.m_long_value + 7),
              (MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue>,_prop::ReadOnly,_2UL,_void>
               *)((long)&obj2.m_long_value + 2));
  prop::
  MethodProperty<BasicMethodProperties,int,prop::detail::GetterWrapper<BasicMethodProperties,int,&(BasicMethodProperties::getIntValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,int,&BasicMethodProperties::setIntValue2>,4ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,int,prop::detail::GetterWrapper<BasicMethodProperties,int,&(BasicMethodProperties::getIntValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,int,&BasicMethodProperties::setIntValue2>,4ul,prop::ReadWrite>
               *)((long)&obj.m_long_value + 4),
              (MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue>,_prop::ReadOnly,_0UL,_void>
               *)&obj2.m_long_value);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>_>
  ::operator()(&local_398,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>_>
                *)((long)&obj.m_long_value + 7));
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_378,"\"john\"","obj.string_value()",(char (*) [5])"john",
             &local_398);
  std::__cxx11::string::~string((string *)&local_398);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x25f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_3c0[1] = 0x48;
  local_3c0[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::setIntValue2>,_4UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::setIntValue2>,_4UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>_>
                               *)((long)&obj.m_long_value + 4));
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_3b8,"72","obj.int_value()",local_3c0 + 1,local_3c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x260,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  piVar3 = BasicMethodProperties::getIntValueTest((BasicMethodProperties *)local_120);
  *piVar3 = 0xe;
  psVar4 = BasicMethodProperties::getStringValueTest_abi_cxx11_((BasicMethodProperties *)local_120);
  std::__cxx11::string::operator=((string *)psVar4,"kate");
  prop::
  MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string_const&,&(BasicMethodProperties::getStringValue2CRef()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string_const&,&BasicMethodProperties::setStringValue2CRef>,8ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string_const&,&(BasicMethodProperties::getStringValue2CRef()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string_const&,&BasicMethodProperties::setStringValue2CRef>,8ul,prop::ReadWrite>
               *)&obj.field_0x78,
              (MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue>,_prop::ReadOnly,_2UL,_void>
               *)((long)&obj2.m_long_value + 2));
  prop::
  MethodProperty<BasicMethodProperties,int,prop::detail::GetterWrapper<BasicMethodProperties,int_const&,&(BasicMethodProperties::getIntValue2CRef()const)>,prop::detail::SetterWrapper<BasicMethodProperties,int_const&,&BasicMethodProperties::setIntValue2CRef>,5ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,int,prop::detail::GetterWrapper<BasicMethodProperties,int_const&,&(BasicMethodProperties::getIntValue2CRef()const)>,prop::detail::SetterWrapper<BasicMethodProperties,int_const&,&BasicMethodProperties::setIntValue2CRef>,5ul,prop::ReadWrite>
               *)((long)&obj.m_long_value + 5),
              (MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue>,_prop::ReadOnly,_0UL,_void>
               *)&obj2.m_long_value);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::setStringValue2CRef>,_8UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>_>
  ::operator()(&local_400,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::setStringValue2CRef>,_8UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>_>
                *)&obj.field_0x78);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_3e0,"\"kate\"","obj.string_value2()",(char (*) [5])"kate",
             &local_400);
  std::__cxx11::string::~string((string *)&local_400);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x266,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  local_428[1] = 0xe;
  local_428[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::setIntValue2CRef>,_5UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::setIntValue2CRef>,_5UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>_>
                               *)((long)&obj.m_long_value + 5));
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_420,"14","obj.int_value2()",local_428 + 1,local_428);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x267,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  piVar3 = BasicMethodProperties::getIntValueTest((BasicMethodProperties *)local_120);
  *piVar3 = 0x61;
  psVar4 = BasicMethodProperties::getStringValueTest_abi_cxx11_((BasicMethodProperties *)local_120);
  std::__cxx11::string::operator=((string *)psVar4,"jane");
  prop::
  MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2_()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string&&,&BasicMethodProperties::setStringValue2RVRef>,9ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2_()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string&&,&BasicMethodProperties::setStringValue2RVRef>,9ul,prop::ReadWrite>
               *)&obj.field_0x79,
              (MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue>,_prop::ReadOnly,_2UL,_void>
               *)((long)&obj2.m_long_value + 2));
  prop::
  MethodProperty<BasicMethodProperties,int,prop::detail::GetterWrapper<BasicMethodProperties,int,&(BasicMethodProperties::getIntValue2_()const)>,prop::detail::SetterWrapper<BasicMethodProperties,int&&,&BasicMethodProperties::setIntValue2RVRef>,6ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,int,prop::detail::GetterWrapper<BasicMethodProperties,int,&(BasicMethodProperties::getIntValue2_()const)>,prop::detail::SetterWrapper<BasicMethodProperties,int&&,&BasicMethodProperties::setIntValue2RVRef>,6ul,prop::ReadWrite>
               *)((long)&obj.m_long_value + 6),
              (MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue>,_prop::ReadOnly,_0UL,_void>
               *)&obj2.m_long_value);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_&BasicMethodProperties::setStringValue2RVRef>,_9UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>_>
  ::operator()(&local_468,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_&BasicMethodProperties::setStringValue2RVRef>,_9UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>_>
                *)&obj.field_0x79);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_448,"\"jane\"","obj.string_value3()",(char (*) [5])"jane",
             &local_468);
  std::__cxx11::string::~string((string *)&local_468);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x26d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_470);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  local_490[1] = 0x61;
  local_490[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_int_&&,_&BasicMethodProperties::setIntValue2RVRef>,_6UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_int_&&,_&BasicMethodProperties::setIntValue2RVRef>,_6UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>_>
                               *)((long)&obj.m_long_value + 6));
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_488,"97","obj.int_value3()",local_490 + 1,local_490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x26e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  piVar3 = BasicMethodProperties::getIntValue2Test((BasicMethodProperties *)local_120);
  *piVar3 = 0x13;
  psVar4 = BasicMethodProperties::getStringValue2Test_abi_cxx11_((BasicMethodProperties *)local_120)
  ;
  std::__cxx11::string::operator=((string *)psVar4,"greg");
  prop::
  MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder,&(BasicMethodProperties::getStringHolder()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder,&BasicMethodProperties::setStringHolder>,10ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder,&(BasicMethodProperties::getStringHolder()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder,&BasicMethodProperties::setStringHolder>,10ul,prop::ReadWrite>
               *)&obj.field_0x7a,
              (MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>
               *)((long)&obj2.m_long_value + 7));
  prop::
  MethodProperty<BasicMethodProperties,long_long,prop::detail::GetterWrapper<BasicMethodProperties,long_long,&(BasicMethodProperties::getLongValue()const)>,prop::detail::SetterWrapper<BasicMethodProperties,long_long,&BasicMethodProperties::setLongValue>,13ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,long_long,prop::detail::GetterWrapper<BasicMethodProperties,long_long,&(BasicMethodProperties::getLongValue()const)>,prop::detail::SetterWrapper<BasicMethodProperties,long_long,&BasicMethodProperties::setLongValue>,13ul,prop::ReadWrite>
               *)&obj.field_0x7d,
              (MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::setIntValue2>,_4UL,_prop::ReadWrite>
               *)((long)&obj2.m_long_value + 4));
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>,_prop::detail::SetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::setStringHolder>,_10UL,_prop::ReadWrite>,_BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>_>
  ::operator()((StringHolder *)&local_4d0,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>,_prop::detail::SetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::setStringHolder>,_10UL,_prop::ReadWrite>,_BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>_>
                *)&obj.field_0x7a);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_4b0,"\"greg\"","obj.string_holder().string",
             (char (*) [5])"greg",&local_4d0);
  StringHolder::~StringHolder((StringHolder *)&local_4d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x274,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  local_4f4 = 0x13;
  local_500 = prop::detail::
              PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_long_long,_prop::detail::GetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::getLongValue>,_prop::detail::SetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::setLongValue>,_13UL,_prop::ReadWrite>,_BasicMethodProperties,_long_long,_prop::detail::GetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::getLongValue>_>
              ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_long_long,_prop::detail::GetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::getLongValue>,_prop::detail::SetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::setLongValue>,_13UL,_prop::ReadWrite>,_BasicMethodProperties,_long_long,_prop::detail::GetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::getLongValue>_>
                            *)&obj.field_0x7d);
  testing::internal::EqHelper<false>::Compare<int,long_long>
            ((EqHelper<false> *)local_4f0,"19","obj.long_value()",&local_4f4,&local_500);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar1) {
    testing::Message::Message(&local_508);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x275,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  piVar3 = BasicMethodProperties::getIntValueTest((BasicMethodProperties *)local_120);
  *piVar3 = 0x33;
  psVar4 = BasicMethodProperties::getStringValueTest_abi_cxx11_((BasicMethodProperties *)local_120);
  std::__cxx11::string::operator=((string *)psVar4,"phill");
  prop::
  MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder,&(BasicMethodProperties::getStringHolder()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder,&BasicMethodProperties::setStringHolder>,10ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder,&(BasicMethodProperties::getStringHolder()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder,&BasicMethodProperties::setStringHolder>,10ul,prop::ReadWrite>
               *)&obj.field_0x7a,
              (MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue>,_prop::ReadOnly,_2UL,_void>
               *)((long)&obj2.m_long_value + 2));
  prop::
  MethodProperty<BasicMethodProperties,long_long,prop::detail::GetterWrapper<BasicMethodProperties,long_long,&(BasicMethodProperties::getLongValue()const)>,prop::detail::SetterWrapper<BasicMethodProperties,long_long,&BasicMethodProperties::setLongValue>,13ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,long_long,prop::detail::GetterWrapper<BasicMethodProperties,long_long,&(BasicMethodProperties::getLongValue()const)>,prop::detail::SetterWrapper<BasicMethodProperties,long_long,&BasicMethodProperties::setLongValue>,13ul,prop::ReadWrite>
               *)&obj.field_0x7d,
              (MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue>,_prop::ReadOnly,_0UL,_void>
               *)&obj2.m_long_value);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>,_prop::detail::SetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::setStringHolder>,_10UL,_prop::ReadWrite>,_BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>_>
  ::operator()((StringHolder *)&local_540,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>,_prop::detail::SetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::setStringHolder>,_10UL,_prop::ReadWrite>,_BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>_>
                *)&obj.field_0x7a);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_520,"\"phill\"","obj.string_holder().string",
             (char (*) [6])"phill",&local_540);
  StringHolder::~StringHolder((StringHolder *)&local_540);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(&local_548);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x27b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  local_564 = 0x33;
  local_570 = prop::detail::
              PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_long_long,_prop::detail::GetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::getLongValue>,_prop::detail::SetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::setLongValue>,_13UL,_prop::ReadWrite>,_BasicMethodProperties,_long_long,_prop::detail::GetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::getLongValue>_>
              ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_long_long,_prop::detail::GetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::getLongValue>,_prop::detail::SetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::setLongValue>,_13UL,_prop::ReadWrite>,_BasicMethodProperties,_long_long,_prop::detail::GetterWrapper<BasicMethodProperties,_long_long,_&BasicMethodProperties::getLongValue>_>
                            *)&obj.field_0x7d);
  testing::internal::EqHelper<false>::Compare<int,long_long>
            ((EqHelper<false> *)local_560,"51","obj.long_value()",&local_564,&local_570);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x27c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  psVar4 = BasicMethodProperties::getStringValue2Test_abi_cxx11_((BasicMethodProperties *)local_120)
  ;
  std::__cxx11::string::operator=((string *)psVar4,"matt");
  prop::
  MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder_const&,&(BasicMethodProperties::getStringHolderCRef()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder_const&,&BasicMethodProperties::setStringHolderCRef>,11ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder_const&,&(BasicMethodProperties::getStringHolderCRef()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder_const&,&BasicMethodProperties::setStringHolderCRef>,11ul,prop::ReadWrite>
               *)&obj.field_0x7b,
              (MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>
               *)((long)&obj2.m_long_value + 7));
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>,_prop::detail::SetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::setStringHolder>,_10UL,_prop::ReadWrite>,_BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>_>
  ::operator()((StringHolder *)&local_5b0,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>,_prop::detail::SetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::setStringHolder>,_10UL,_prop::ReadWrite>,_BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>_>
                *)&obj.field_0x7a);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_590,"\"matt\"","obj.string_holder().string",
             (char (*) [5])"matt",&local_5b0);
  StringHolder::~StringHolder((StringHolder *)&local_5b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_590);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x280,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  psVar4 = BasicMethodProperties::getStringValue2Test_abi_cxx11_((BasicMethodProperties *)local_120)
  ;
  std::__cxx11::string::operator=((string *)psVar4,"sam");
  prop::
  MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder,&(BasicMethodProperties::getStringHolder_()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder&&,&BasicMethodProperties::setStringHolderRVRef>,12ul,prop::ReadWrite>
  ::operator=((MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder,&(BasicMethodProperties::getStringHolder_()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder&&,&BasicMethodProperties::setStringHolderRVRef>,12ul,prop::ReadWrite>
               *)&obj.field_0x7c,
              (MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>
               *)((long)&obj2.m_long_value + 7));
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>,_prop::detail::SetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::setStringHolder>,_10UL,_prop::ReadWrite>,_BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>_>
  ::operator()((StringHolder *)&local_5f0,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>,_prop::detail::SetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::setStringHolder>,_10UL,_prop::ReadWrite>,_BasicMethodProperties,_StringHolder,_prop::detail::GetterWrapper<BasicMethodProperties,_StringHolder,_&BasicMethodProperties::getStringHolder>_>
                *)&obj.field_0x7a);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_5d0,"\"sam\"","obj.string_holder().string",(char (*) [4])"sam"
             ,&local_5f0);
  StringHolder::~StringHolder((StringHolder *)&local_5f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_5f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x284,pcVar2);
    testing::internal::AssertHelper::operator=(&local_600,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper(&local_600);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  BasicMethodProperties::~BasicMethodProperties((BasicMethodProperties *)local_120);
  BasicMethodProperties::~BasicMethodProperties((BasicMethodProperties *)&obj2.field_0x80);
  return;
}

Assistant:

TEST(MethodProperty, SetFromProperty)
{
  BasicMethodProperties obj;
  BasicMethodProperties obj2;

  EXPECT_EQ( "", obj.string_value() );
  EXPECT_EQ( 0, obj.int_value() );
  EXPECT_EQ( "", obj.string_value2() );
  EXPECT_EQ( 0, obj.int_value2() );
  EXPECT_EQ( "", obj.string_value3() );
  EXPECT_EQ( 0, obj.int_value3() );
  EXPECT_EQ( 0, obj.long_value() );

  obj2.getIntValue2Test() = 65;
  obj2.getStringValue2Test() = "bob";
  obj.string_value = obj2.string_value;
  obj.int_value = obj2.int_value;
  EXPECT_EQ( "bob", obj.string_value() );
  EXPECT_EQ( 65, obj.int_value() );
  
  obj2.getIntValue2Test() = 23;
  obj2.getStringValue2Test() = "bill";
  obj.string_value = obj2.string_value2;
  obj.int_value = obj2.int_value2;
  EXPECT_EQ( "bill", obj.string_value() );
  EXPECT_EQ( 23, obj.int_value() );
  
  obj2.getIntValueTest() = 72;
  obj2.getStringValueTest() = "john";
  obj.string_value = obj2.ro_string_value;
  obj.int_value = obj2.ro_int_value;
  EXPECT_EQ( "john", obj.string_value() );
  EXPECT_EQ( 72, obj.int_value() );
  
  obj2.getIntValueTest() = 14;
  obj2.getStringValueTest() = "kate";
  obj.string_value2 = obj2.ro_string_value;
  obj.int_value2 = obj2.ro_int_value;
  EXPECT_EQ( "kate", obj.string_value2() );
  EXPECT_EQ( 14, obj.int_value2() );
  
  obj2.getIntValueTest() = 97;
  obj2.getStringValueTest() = "jane";
  obj.string_value3 = obj2.ro_string_value;
  obj.int_value3 = obj2.ro_int_value;
  EXPECT_EQ( "jane", obj.string_value3() );
  EXPECT_EQ( 97, obj.int_value3() );
  
  obj2.getIntValue2Test() = 19;
  obj2.getStringValue2Test() = "greg";
  obj.string_holder = obj2.string_value;
  obj.long_value = obj2.int_value;
  EXPECT_EQ( "greg", obj.string_holder().string );
  EXPECT_EQ( 19, obj.long_value() );
  
  obj2.getIntValueTest() = 51;
  obj2.getStringValueTest() = "phill";
  obj.string_holder = obj2.ro_string_value;
  obj.long_value = obj2.ro_int_value;
  EXPECT_EQ( "phill", obj.string_holder().string );
  EXPECT_EQ( 51, obj.long_value() );
  
  obj2.getStringValue2Test() = "matt";
  obj.string_holder2 = obj2.string_value;
  EXPECT_EQ( "matt", obj.string_holder().string );
  
  obj2.getStringValue2Test() = "sam";
  obj.string_holder3 = obj2.string_value;
  EXPECT_EQ( "sam", obj.string_holder().string );
}